

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)27>::~BlockExprBase(BlockExprBase<(wabt::ExprType)27> *this)

{
  (this->super_ExprMixin<(wabt::ExprType)27>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BlockExprBase_001e4310;
  Block::~Block(&this->block);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}